

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  ushort uVar1;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar2;
  ushort uVar3;
  ArrayPtr<capnp::word> AVar4;
  unsigned_long local_28;
  
  if ((0x6f < node._reader.dataSize) && (*(short *)((long)node._reader.data + 0xc) == 1)) {
    local_28 = *node._reader.data;
    MVar2 = kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long>
                      (&this->structSizeRequirements,&local_28);
    if (MVar2.ptr != (RequiredSize *)0x0) {
      if (node._reader.dataSize < 0x80) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)((long)node._reader.data + 0xe);
      }
      if (uVar3 < (MVar2.ptr)->dataWordCount) {
        uVar1 = (MVar2.ptr)->pointerCount;
      }
      else {
        if (node._reader.dataSize < 0xd0) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)((long)node._reader.data + 0x18);
        }
        uVar1 = (MVar2.ptr)->pointerCount;
        if (uVar1 <= uVar3) goto LAB_0016dd99;
      }
      AVar4 = rewriteStructNodeWithSizes(this,node,(uint)(MVar2.ptr)->dataWordCount,(uint)uVar1);
      return AVar4;
    }
  }
LAB_0016dd99:
  AVar4 = makeUncheckedNode(this,node);
  return AVar4;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_MAYBE(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement->dataWordCount ||
          structNode.getPointerCount() < requirement->pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement->dataWordCount,
                                          requirement->pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}